

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O2

void __thiscall
Pl_Function::Pl_Function
          (Pl_Function *this,char *identifier,Pipeline *next,writer_c_char_t fn,void *udata)

{
  Members *pMVar1;
  undefined8 uVar2;
  function<void_(const_unsigned_char_*,_unsigned_long)> *this_00;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data __tmp;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_002ac508;
  this_00 = (function<void_(const_unsigned_char_*,_unsigned_long)> *)operator_new(0x20);
  local_58 = 0;
  uStack_50 = 0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  std::function<void_(const_unsigned_char_*,_unsigned_long)>::function
            (this_00,(function<void_(const_unsigned_char_*,_unsigned_long)> *)&local_68);
  (this->m)._M_t.
  super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>.
  super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl = (Members *)this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>
           .super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl;
  local_78 = (_Manager_type)0x0;
  p_Stack_70 = (_Invoker_type)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  __tmp._M_unused._M_object = operator_new(0x18);
  *(char **)__tmp._M_unused._0_8_ = identifier;
  *(writer_c_char_t *)((long)__tmp._M_unused._0_8_ + 8) = fn;
  *(void **)((long)__tmp._M_unused._0_8_ + 0x10) = udata;
  __tmp._8_8_ = local_88._8_8_;
  local_88._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pMVar1->fn).super__Function_base;
  uVar2 = *(undefined8 *)((long)&(pMVar1->fn).super__Function_base + 8);
  *(undefined8 *)&(pMVar1->fn).super__Function_base = __tmp._M_unused._M_object;
  *(undefined8 *)((long)&(pMVar1->fn).super__Function_base + 8) = local_88._8_8_;
  local_78 = *(_Manager_type *)((long)&(pMVar1->fn).super__Function_base + 0x10);
  *(code **)((long)&(pMVar1->fn).super__Function_base + 0x10) =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/Pl_Function.cc:41:13)>
       ::_M_manager;
  p_Stack_70 = (pMVar1->fn)._M_invoker;
  (pMVar1->fn)._M_invoker =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/Pl_Function.cc:41:13)>
       ::_M_invoke;
  local_88._8_8_ = uVar2;
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_c_char_t fn, void* udata) :
    Pipeline(identifier, next),
    m(new Members(nullptr))
{
    m->fn = [identifier, fn, udata](unsigned char const* data, size_t len) {
        int code = fn(reinterpret_cast<char const*>(data), len, udata);
        if (code != 0) {
            throw std::runtime_error(
                std::string(identifier) + " function returned code " + std::to_string(code));
        }
    };
}